

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_14fcaed::AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test::TestBody
          (AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test *this)

{
  uint uVar1;
  int width;
  ParamType *pPVar2;
  highbd_compound_conv_2d_copy_func test_func;
  uint16_t *src1;
  int height;
  uint16_t *dst;
  CompoundParam *compound;
  pointer conv_buf;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  compound_params;
  CONV_BUF_TYPE test_conv_buf [16384];
  uint16_t test [16384];
  CONV_BUF_TYPE reference_conv_buf [16384];
  uint16_t reference [16384];
  CompoundParam *in_stack_fffffffffffdff60;
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  vStack_20078;
  uint16_t auStack_20060 [16384];
  uint16_t auStack_18060 [16384];
  undefined1 auStack_10060 [65584];
  
  GetCompoundParams();
  for (conv_buf = vStack_20078.
                  super__Vector_base<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      conv_buf !=
      vStack_20078.
      super__Vector_base<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
      ._M_impl.super__Vector_impl_data._M_finish; conv_buf = conv_buf + 1) {
    pPVar2 = testing::
             WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
             ::GetParam();
    uVar1 = (pPVar2->block_).width_;
    width = (pPVar2->block_).height_;
    pPVar2 = testing::
             WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
             ::GetParam();
    test_func = (highbd_compound_conv_2d_copy_func)
                AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                                 *)this,(this->super_AV1Convolve2DCopyHighbdCompoundTest).
                                        super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                                        .input16_1_,pPVar2);
    pPVar2 = testing::
             WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
             ::GetParam();
    src1 = AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
           ::RandomInput16((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                            *)this,(this->super_AV1Convolve2DCopyHighbdCompoundTest).
                                   super_AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                                   .input16_2_,pPVar2);
    AV1Convolve2DCopyHighbdCompoundTest::Convolve
              ((AV1Convolve2DCopyHighbdCompoundTest *)av1_highbd_dist_wtd_convolve_2d_copy_c,
               test_func,src1,(uint16_t *)(auStack_10060 + 0x8000),(uint16_t *)auStack_10060,
               (uint16_t *)conv_buf,in_stack_fffffffffffdff60);
    pPVar2 = testing::
             WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>_>
             ::GetParam();
    dst = auStack_20060;
    AV1Convolve2DCopyHighbdCompoundTest::Convolve
              ((AV1Convolve2DCopyHighbdCompoundTest *)pPVar2->test_func_,test_func,src1,
               auStack_18060,dst,(uint16_t *)conv_buf,in_stack_fffffffffffdff60);
    height = (int)dst;
    AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
    ::AssertOutputBufferEq
              ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                *)auStack_10060,auStack_20060,(uint16_t *)(ulong)uVar1,width,height);
    AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
    ::AssertOutputBufferEq
              ((AV1ConvolveTest<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_ConvolveParams_*,_int)>
                *)(auStack_10060 + 0x8000),auStack_18060,(uint16_t *)(ulong)uVar1,width,height);
  }
  std::
  vector<(anonymous_namespace)::CompoundParam,_std::allocator<(anonymous_namespace)::CompoundParam>_>
  ::~vector(&vStack_20078);
  return;
}

Assistant:

TEST_P(AV1Convolve2DCopyHighbdCompoundTest, RunTest) { RunTest(); }